

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O2

void __thiscall fineftp::FtpSession::handleFtpCommandHELP(FtpSession *this,string *param_1)

{
  allocator local_31;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,"Command not implemented",&local_31);
  sendFtpMessage(this,COMMAND_NOT_IMPLEMENTED,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void FtpSession::handleFtpCommandHELP(const std::string& /*param*/)
  {
    sendFtpMessage(FtpReplyCode::COMMAND_NOT_IMPLEMENTED, "Command not implemented");
  }